

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O1

void __thiscall KDIS::KDataStream::Write<double>(KDataStream *this,double T)

{
  double *pdVar1;
  long lVar2;
  KUINT8 i;
  KOCTET Temp [8];
  NetToDataType<double> OctArray;
  undefined8 uStack_30;
  double local_28;
  double local_20;
  
  local_20 = T;
  if (this->m_MachineEndian != this->m_NetEndian) {
    pdVar1 = &local_20;
    local_28 = T;
    lVar2 = 8;
    do {
      *(undefined1 *)pdVar1 = *(undefined1 *)((long)&uStack_30 + lVar2 + 7);
      pdVar1 = (double *)((long)pdVar1 + 1);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar2 = 0;
  do {
    local_28 = (double)CONCAT71(local_28._1_7_,*(undefined1 *)((long)&local_20 + lVar2));
    uStack_30 = 0x220b1f;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->m_vBuffer,(uchar *)&local_28);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}